

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

Vec_Str_t * Abc_SclProduceGenlibStrSimple(SC_Lib *p)

{
  Vec_Str_t *p_00;
  undefined8 *puVar1;
  size_t sVar2;
  undefined8 *puVar3;
  int i;
  char *pStr;
  int i_00;
  int i_01;
  char Buffer [200];
  char local_f8 [200];
  
  p_00 = Vec_StrAlloc((int)p);
  Vec_StrPrintStr(p_00,"GATE _const0_            0.00 z=CONST0;\n");
  Vec_StrPrintStr(p_00,"GATE _const1_            0.00 z=CONST1;\n");
  i = 0;
  do {
    if ((p->vCells).nSize <= i) {
      Vec_StrPrintStr(p_00,"\n.end\n");
      Vec_StrPush(p_00,'\0');
      return p_00;
    }
    puVar1 = (undefined8 *)Vec_PtrEntry(&p->vCells,i);
    i_01 = *(int *)(puVar1 + 8);
    if (i_01 != 0) {
      sVar2 = strlen((char *)*puVar1);
      if (199 < sVar2) {
        __assert_fail("strlen(pCell->pName) < 200",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                      ,0x32c,"Vec_Str_t *Abc_SclProduceGenlibStrSimple(SC_Lib *)");
      }
      for (; i_01 < *(int *)((long)puVar1 + 0x34); i_01 = i_01 + 1) {
        puVar3 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar1 + 6),i_01);
        Vec_StrPrintStr(p_00,"GATE ");
        i_00 = 0;
        sprintf(local_f8,"%-16s",*puVar1);
        Vec_StrPrintStr(p_00,local_f8);
        Vec_StrPrintStr(p_00," ");
        sprintf(local_f8,"%7.2f",SUB84((double)*(float *)(puVar1 + 3),0));
        Vec_StrPrintStr(p_00,local_f8);
        Vec_StrPrintStr(p_00," ");
        Vec_StrPrintStr(p_00,(char *)*puVar3);
        Vec_StrPrintStr(p_00,"=");
        pStr = (char *)puVar3[5];
        if (pStr == (char *)0x0) {
          pStr = "?";
        }
        Vec_StrPrintStr(p_00,pStr);
        Vec_StrPrintStr(p_00,";\n");
        for (; i_00 < *(int *)(puVar1 + 8); i_00 = i_00 + 1) {
          puVar3 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar1 + 6),i_00);
          Vec_StrPrintStr(p_00,"         PIN ");
          sprintf(local_f8,"%-4s",*puVar3);
          Vec_StrPrintStr(p_00,local_f8);
          builtin_strncpy(local_f8 + 0x20,"00  0.00\n",10);
          builtin_strncpy(local_f8 + 0x10,"  1.00  0.00  1.",0x10);
          builtin_strncpy(local_f8," UNKNOWN  1  999",0x10);
          Vec_StrPrintStr(p_00,local_f8);
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStrSimple( SC_Lib * p )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pCell;
    SC_Pin * pPin, * pPinOut;
    int i, j, k, Count = 2;
    // mark skipped cells
//    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCell( p, pCell, i )
    {
        if ( pCell->n_inputs == 0 )
            continue;
        assert( strlen(pCell->pName) < 200 );
        SC_CellForEachPinOut( pCell, pPinOut, j )
        {
            Vec_StrPrintStr( vStr, "GATE " );
            sprintf( Buffer, "%-16s", pCell->pName );
            Vec_StrPrintStr( vStr, Buffer );
            Vec_StrPrintStr( vStr, " " );
            sprintf( Buffer, "%7.2f", pCell->area );
            Vec_StrPrintStr( vStr, Buffer );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, pPinOut->pName );
            Vec_StrPrintStr( vStr, "=" );
            Vec_StrPrintStr( vStr, pPinOut->func_text ? pPinOut->func_text : "?" );
            Vec_StrPrintStr( vStr, ";\n" );
            SC_CellForEachPinIn( pCell, pPin, k )
            {
                Vec_StrPrintStr( vStr, "         PIN " );
                sprintf( Buffer, "%-4s", pPin->pName );
                Vec_StrPrintStr( vStr, Buffer );
                sprintf( Buffer, " UNKNOWN  1  999  1.00  0.00  1.00  0.00\n" );
                Vec_StrPrintStr( vStr, Buffer );
            }
            Count++;
        }
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    return vStr;
}